

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iRpn.cpp
# Opt level: O3

void __thiscall Imaginer::Utils::iRpn::iRpn(iRpn *this)

{
  iStack<char> *piVar1;
  char *pcVar2;
  iStack<Imaginer::Utils::iRpn::RPNnode> *this_00;
  int local_14;
  
  this->_expnames = (char *)0x0;
  this->_curpos = 0;
  piVar1 = (iStack<char> *)operator_new(0x10);
  piVar1->_size = 0x400;
  piVar1->_top = -1;
  pcVar2 = (char *)operator_new__(0x400);
  piVar1->_data = pcVar2;
  this->_operator = piVar1;
  piVar1->_top = 0;
  *pcVar2 = '#';
  this_00 = (iStack<Imaginer::Utils::iRpn::RPNnode> *)operator_new(0x10);
  iStack<Imaginer::Utils::iRpn::RPNnode>::iStack(this_00,&local_14);
  this->_operands = this_00;
  return;
}

Assistant:

iRpn::iRpn():_expnames(NULL),_curpos(0)
{
    _operator = new iStack<char>;
    _operator->push('#');
    _operands = new iStack<RPNnode>;
}